

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

typed_option<std::vector<int,_std::allocator<int>_>_> * __thiscall
VW::config::typed_option<std::vector<int,_std::allocator<int>_>_>::value
          (typed_option<std::vector<int,_std::allocator<int>_>_> *this,
          vector<int,_std::allocator<int>_> *value)

{
  typed_option<std::vector<int,_std::allocator<int>_>_> *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffe0;
  
  std::make_shared<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>&>
            (in_stack_00000008);
  std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::operator=
            (in_stack_ffffffffffffffe0,(shared_ptr<std::vector<int,_std::allocator<int>_>_> *)in_RDI
            );
  std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr
            ((shared_ptr<std::vector<int,_std::allocator<int>_>_> *)0x1f3bb0);
  return in_RDI;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }